

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

bool __thiscall mpt::message_store::set_ignore_level(message_store *this,int val)

{
  int local_1c;
  int val_local;
  message_store *this_local;
  
  if (val < 0) {
    local_1c = 0x10;
  }
  else {
    local_1c = val;
    if (0x1f < val) {
      return false;
    }
  }
  this->_ignore = (uint8_t)local_1c;
  return true;
}

Assistant:

bool message_store::set_ignore_level(int val)
{
	if (val < 0) {
		val = Debug;
	}
	else if (val >= File) {
		return false;
	}
	_ignore = val;
	return true;
}